

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ExpressionSyntax *args_2;
  ImplicationConstraintSyntax *pIVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000118;
  Token *in_stack_00000120;
  BumpAllocator *in_stack_ffffffffffffffc8;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa35966);
  args_2 = deepClone<slang::syntax::ExpressionSyntax>
                     ((ExpressionSyntax *)__child_stack,in_stack_ffffffffffffffc8);
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  not_null<slang::syntax::ConstraintItemSyntax_*>::operator*
            ((not_null<slang::syntax::ConstraintItemSyntax_*> *)0xa359a3);
  deepClone<slang::syntax::ConstraintItemSyntax>
            ((ConstraintItemSyntax *)__child_stack,in_stack_ffffffffffffffc8);
  pIVar1 = BumpAllocator::
           emplace<slang::syntax::ImplicationConstraintSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ConstraintItemSyntax&>
                     (this,(ExpressionSyntax *)TVar2.info,TVar2._0_8_,(ConstraintItemSyntax *)args_2
                     );
  return (int)pIVar1;
}

Assistant:

static SyntaxNode* clone(const ImplicationConstraintSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ImplicationConstraintSyntax>(
        *deepClone<ExpressionSyntax>(*node.left, alloc),
        node.arrow.deepClone(alloc),
        *deepClone<ConstraintItemSyntax>(*node.constraints, alloc)
    );
}